

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
::moveFromOldBuckets
          (DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
           *this,DenseMapPair<DBKeyID,_llbuild::core::KeyID> *OldBucketsBegin,
          DenseMapPair<DBKeyID,_llbuild::core::KeyID> *OldBucketsEnd)

{
  bool bVar1;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *in_RAX;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *DestBucket;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *local_28;
  
  local_28 = in_RAX;
  initEmpty(this);
  do {
    if (OldBucketsBegin == OldBucketsEnd) {
      return;
    }
    if ((OldBucketsBegin->super_pair<DBKeyID,_llbuild::core::KeyID>).first.value <
        0xfffffffffffffffe) {
      bVar1 = LookupBucketFor<DBKeyID>(this,(DBKeyID *)OldBucketsBegin,&local_28);
      if (bVar1) {
        __assert_fail("!FoundVal && \"Key already in new map?\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                      ,0x176,
                      "void llvm::DenseMapBase<llvm::DenseMap<DBKeyID, llbuild::core::KeyID>, DBKeyID, llbuild::core::KeyID, llvm::DenseMapInfo<DBKeyID>, llvm::detail::DenseMapPair<DBKeyID, llbuild::core::KeyID>>::moveFromOldBuckets(BucketT *, BucketT *) [DerivedT = llvm::DenseMap<DBKeyID, llbuild::core::KeyID>, KeyT = DBKeyID, ValueT = llbuild::core::KeyID, KeyInfoT = llvm::DenseMapInfo<DBKeyID>, BucketT = llvm::detail::DenseMapPair<DBKeyID, llbuild::core::KeyID>]"
                     );
      }
      (local_28->super_pair<DBKeyID,_llbuild::core::KeyID>).first.value =
           (OldBucketsBegin->super_pair<DBKeyID,_llbuild::core::KeyID>).first.value;
      (local_28->super_pair<DBKeyID,_llbuild::core::KeyID>).second._value =
           (OldBucketsBegin->super_pair<DBKeyID,_llbuild::core::KeyID>).second._value;
      *(int *)(this + 8) = *(int *)(this + 8) + 1;
    }
    OldBucketsBegin = OldBucketsBegin + 1;
  } while( true );
}

Assistant:

void moveFromOldBuckets(BucketT *OldBucketsBegin, BucketT *OldBucketsEnd) {
    initEmpty();

    // Insert all the old elements.
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    for (BucketT *B = OldBucketsBegin, *E = OldBucketsEnd; B != E; ++B) {
      if (!KeyInfoT::isEqual(B->getFirst(), EmptyKey) &&
          !KeyInfoT::isEqual(B->getFirst(), TombstoneKey)) {
        // Insert the key/value into the new table.
        BucketT *DestBucket;
        bool FoundVal = LookupBucketFor(B->getFirst(), DestBucket);
        (void)FoundVal; // silence warning.
        assert(!FoundVal && "Key already in new map?");
        DestBucket->getFirst() = std::move(B->getFirst());
        ::new (&DestBucket->getSecond()) ValueT(std::move(B->getSecond()));
        incrementNumEntries();

        // Free the value.
        B->getSecond().~ValueT();
      }
      B->getFirst().~KeyT();
    }
  }